

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

wchar_t find_accel(wchar_t accel,win_menu *mdat)

{
  wchar_t local_24;
  wchar_t local_1c;
  wchar_t upper;
  wchar_t i;
  win_menu *mdat_local;
  wchar_t accel_local;
  
  if (mdat->icount < mdat->offset + mdat->innerheight) {
    local_24 = mdat->icount;
  }
  else {
    local_24 = mdat->offset + mdat->innerheight;
  }
  for (local_1c = mdat->offset; local_1c < local_24; local_1c = local_1c + L'\x01') {
    if (mdat->items[local_1c].accel == accel) {
      return local_1c;
    }
  }
  for (local_1c = mdat->offset; local_1c < local_24; local_1c = local_1c + L'\x01') {
    if (mdat->items[local_1c].group_accel == accel) {
      return local_1c;
    }
  }
  if (mdat->innerheight < mdat->icount) {
    for (local_1c = L'\0'; local_1c < mdat->icount; local_1c = local_1c + L'\x01') {
      if (mdat->items[local_1c].accel == accel) {
        if (mdat->offset < local_1c) {
          mdat->offset = (local_1c - mdat->innerheight) + L'\x01';
        }
        else {
          mdat->offset = local_1c;
        }
        return local_1c;
      }
    }
  }
  return L'\xffffffff';
}

Assistant:

static int find_accel(int accel, struct win_menu *mdat)
{
    int i, upper;
    
    /*
     * scan visible entries first: long list of (eg the options menu)
     * might re-use accelerators, so that each is only unique among the visible
     * menu items
     */
    upper = min(mdat->icount, mdat->offset + mdat->innerheight);
    for (i = mdat->offset; i < upper; i++)
	if (mdat->items[i].accel == accel)
	    return i;
    
    /* it's not a regular accelerator, maybe there is a group accel? */
    for (i = mdat->offset; i < upper; i++)
	if (mdat->items[i].group_accel == accel)
	    return i;
    /*
     * extra effort: if the list is too long for one page search for the accel
     * among those entries, too and scroll the changed item into view.
     */
    if (mdat->icount > mdat->innerheight)
	for (i = 0; i < mdat->icount; i++)
	    if (mdat->items[i].accel == accel) {
		if (i > mdat->offset)
		    mdat->offset = i - mdat->innerheight + 1;
		else
		    mdat->offset = i;
		return i;
	    }
    
    return -1;
}